

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Futex.cpp
# Opt level: O0

int nativeFutexWake(void *addr,int count,uint32_t wakeMask)

{
  long lVar1;
  uint in_ESI;
  undefined8 in_RDI;
  int rv;
  int local_4;
  
  lVar1 = syscall(0xca,in_RDI,0x8a,(ulong)in_ESI,0);
  local_4 = (int)lVar1;
  if (local_4 < 0) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nativeFutexWake(const void *addr, int count, uint32_t wakeMask) {
#ifndef PSHARED
    int rv = syscall(
            __NR_futex,
            addr, /* addr1 */
            FUTEX_WAKE_BITSET | FUTEX_PRIVATE_FLAG, /* op */
            count, /* val */
            nullptr, /* timeout */
            nullptr, /* addr2 */
            wakeMask); /* val3 */
#else
    int rv = syscall(
                __NR_futex,
                addr, /* addr1 */
                FUTEX_WAKE_BITSET, /* op */
                count, /* val */
                nullptr, /* timeout */
                nullptr, /* addr2 */
                wakeMask); /* val3 */
#endif

    /* NOTE: we ignore errors on wake for the case of a futex
       guarding its own destruction, similar to this
       glibc bug with sem_post/sem_wait:
       https://sourceware.org/bugzilla/show_bug.cgi?id=12674 */
    if (rv < 0) {
        return 0;
    }
    return rv;
}